

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

char * linenoise(char *prompt)

{
  ushort *puVar1;
  char *__s;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ssize_t sVar9;
  size_t sVar10;
  int *piVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  winsize ws;
  linenoiseCompletions lc;
  char buf [4096];
  byte local_10ba;
  char local_10b9;
  char local_10b8;
  byte local_10b7;
  ushort local_10b6 [3];
  linenoiseState local_10b0;
  linenoiseCompletions local_1058;
  undefined2 uStack_1039;
  
  pcVar8 = getenv("TERM");
  if (pcVar8 != (char *)0x0) {
    lVar15 = 0;
    do {
      iVar5 = strcasecmp(pcVar8,*(char **)((long)unsupported_term + lVar15));
      if (iVar5 == 0) {
        printf("%s",prompt);
        fflush(_stdout);
        pcVar8 = fgets((char *)((long)&uStack_1039 + 1),0x1000,_stdin);
        if (pcVar8 == (char *)0x0) {
          return (char *)0x0;
        }
        for (sVar10 = strlen((char *)((long)&uStack_1039 + 1));
            (sVar10 != 0 &&
            ((*(char *)((long)&uStack_1039 + sVar10) == '\r' ||
             (*(char *)((long)&uStack_1039 + sVar10) == '\n')))); sVar10 = sVar10 - 1) {
          *(undefined1 *)((long)&uStack_1039 + sVar10) = 0;
        }
        goto LAB_00127bde;
      }
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x18);
  }
  iVar7 = 0;
  iVar5 = isatty(0);
  if (iVar5 == 0) {
    pcVar8 = fgets((char *)((long)&uStack_1039 + 1),0x1000,_stdin);
    if (pcVar8 == (char *)0x0) {
      return (char *)0x0;
    }
    sVar10 = strlen((char *)((long)&uStack_1039 + 1));
    iVar5 = (int)sVar10;
    if (iVar5 == 0) goto LAB_00127bde;
    if (*(char *)((long)&uStack_1039 + (long)(iVar5 + -1) + 1) == '\n') {
      *(undefined1 *)((long)&uStack_1039 + (long)(iVar5 + -1) + 1) = 0;
      goto LAB_00127bde;
    }
  }
  else {
    iVar5 = enableRawMode(iVar7);
    if (iVar5 == -1) {
      return (char *)0x0;
    }
    local_10b0.ifd = 0;
    local_10b0.ofd = 1;
    local_10b0.buf = (char *)((long)&uStack_1039 + 1);
    local_10b0.buflen = 0x1000;
    local_10b0.prompt = prompt;
    local_10b0.plen = strlen(prompt);
    local_10b0.pos = 0;
    local_10b0.oldpos = 0;
    local_10b0.len = 0;
    iVar7 = 0x5413;
    iVar14 = 1;
    iVar5 = ioctl(1,0x5413,&local_10b8);
    if (local_10b6[0] == 0 || iVar5 == -1) {
      iVar5 = getCursorPosition(iVar14,iVar7);
      uVar13 = 0x50;
      if (iVar5 != -1) {
        iVar7 = 0x139a4b;
        iVar14 = 1;
        sVar9 = write(1,"\x1b[999C",6);
        if (((sVar9 == 6) && (uVar6 = getCursorPosition(iVar14,iVar7), uVar6 != 0xffffffff)) &&
           (uVar13 = uVar6, iVar5 < (int)uVar6)) {
          snprintf((char *)&local_1058,0x20,"\x1b[%dD");
          sVar10 = strlen((char *)&local_1058);
          write(1,&local_1058,sVar10);
        }
      }
    }
    else {
      uVar13 = (uint)local_10b6[0];
    }
    local_10b0.cols = (size_t)(int)uVar13;
    local_10b0.maxrows = 0;
    local_10b0.history_index = 0;
    *local_10b0.buf = '\0';
    local_10b0.buflen = local_10b0.buflen - 1;
    linenoiseHistoryAdd("");
    sVar9 = write(local_10b0.ofd,prompt,local_10b0.plen);
    if (sVar9 == -1) {
LAB_00127ba2:
      uVar12 = 0xffffffff;
    }
    else {
      sVar9 = read(local_10b0.ifd,&local_10ba,1);
      if (0 < (int)sVar9) {
        do {
          uVar13 = (uint)local_10ba;
          if (completionCallback != (linenoiseCompletionCallback *)0x0 && local_10ba == 9) {
            local_1058.len = 0;
            local_1058.cvec = (char **)0x0;
            local_10b9 = '\0';
            (*completionCallback)(local_10b0.buf,&local_1058);
            if (local_1058.len == 0) {
              fputc(7,_stderr);
              fflush(_stderr);
              uVar13 = 0;
            }
            else {
              uVar12 = 0;
              while( true ) {
                sVar3 = local_10b0.len;
                sVar4 = local_10b0.pos;
                pcVar8 = local_10b0.buf;
                if (uVar12 < local_1058.len) {
                  __s = local_1058.cvec[uVar12];
                  local_10b0.pos = strlen(__s);
                  local_10b0.buf = __s;
                  local_10b0.len = local_10b0.pos;
                  refreshLine(&local_10b0);
                  local_10b0.buf = pcVar8;
                  local_10b0.pos = sVar4;
                  local_10b0.len = sVar3;
                }
                else {
                  refreshLine(&local_10b0);
                }
                sVar9 = read(local_10b0.ifd,&local_10b9,1);
                sVar4 = local_1058.len;
                cVar2 = local_10b9;
                if ((int)sVar9 < 1) {
                  uVar13 = 0xffffffff;
                  goto LAB_0012789d;
                }
                if (local_10b9 != '\t') break;
                uVar12 = (uVar12 + 1) % (local_1058.len + 1);
                if (uVar12 == local_1058.len) {
                  fputc(7,_stderr);
                  fflush(_stderr);
                  uVar12 = sVar4;
                }
              }
              if (local_10b9 == '\x1b') {
                if (uVar12 < local_1058.len) {
                  refreshLine(&local_10b0);
                }
              }
              else if (uVar12 < local_1058.len) {
                iVar5 = snprintf(local_10b0.buf,local_10b0.buflen,"%s",local_1058.cvec[uVar12]);
                local_10b0.pos = (size_t)iVar5;
                local_10b0.len = local_10b0.pos;
              }
              uVar13 = (uint)cVar2;
            }
LAB_0012789d:
            if (local_1058.len != 0) {
              uVar12 = 0;
              do {
                free(local_1058.cvec[uVar12]);
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_1058.len);
            }
            if (local_1058.cvec != (char **)0x0) {
              free(local_1058.cvec);
            }
            if (-1 < (int)uVar13) {
              if (uVar13 != 0) goto LAB_001278e1;
              goto switchD_00127aac_caseD_45;
            }
            break;
          }
LAB_001278e1:
          sVar4 = local_10b0.pos;
          switch(uVar13 & 0xff) {
          case 1:
switchD_001278fa_caseD_1:
            if (local_10b0.pos != 0) {
              local_10b0.pos = 0;
              sVar4 = local_10b0.pos;
              goto LAB_00127aeb;
            }
            break;
          case 2:
switchD_001278fa_caseD_2:
            if (local_10b0.pos != 0) {
              sVar4 = local_10b0.pos - 1;
              goto LAB_00127aeb;
            }
            break;
          case 3:
            piVar11 = __errno_location();
            *piVar11 = 0xb;
            goto LAB_00127ba2;
          case 4:
            if (local_10b0.len == 0) {
              lVar15 = (long)history_len;
              history_len = history_len + -1;
              free(history[lVar15 + -1]);
              goto LAB_00127ba2;
            }
LAB_00127a15:
            linenoiseEditDelete(&local_10b0);
            break;
          case 5:
switchD_001278fa_caseD_5:
            sVar4 = local_10b0.len;
            if (local_10b0.pos != local_10b0.len) goto LAB_00127aeb;
            break;
          case 6:
switchD_001278fa_caseD_6:
            if (local_10b0.pos != local_10b0.len) {
LAB_00127ae3:
              sVar4 = local_10b0.pos + 1;
              goto LAB_00127aeb;
            }
            break;
          case 7:
          case 9:
          case 10:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
            goto switchD_001278fa_caseD_7;
          case 8:
switchD_001278fa_caseD_8:
            linenoiseEditBackspace(&local_10b0);
            break;
          case 0xb:
            *(undefined1 *)((long)&uStack_1039 + local_10b0.pos + 1) = 0;
            local_10b0.len = local_10b0.pos;
            goto LAB_00127aeb;
          case 0xc:
            write(1,"\x1b[H\x1b[2J",7);
            sVar4 = local_10b0.pos;
            goto LAB_00127aeb;
          case 0xd:
            lVar15 = (long)history_len;
            history_len = history_len + -1;
            free(history[lVar15 + -1]);
            uVar12 = local_10b0.len;
            if ((mlmode != 0) && (local_10b0.pos != local_10b0.len)) {
              local_10b0.pos = local_10b0.len;
              refreshLine(&local_10b0);
              uVar12 = local_10b0.len;
            }
            goto LAB_00127ba7;
          case 0xe:
switchD_001278fa_caseD_e:
            iVar5 = 0;
            goto LAB_00127afe;
          case 0x10:
switchD_001278fa_caseD_10:
            iVar5 = 1;
LAB_00127afe:
            linenoiseEditHistoryNext(&local_10b0,iVar5);
            break;
          case 0x14:
            if (local_10b0.pos < local_10b0.len && local_10b0.pos != 0) {
              puVar1 = (ushort *)((long)&uStack_1039 + local_10b0.pos);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              if (local_10b0.pos != local_10b0.len - 1) goto LAB_00127ae3;
              goto LAB_00127aeb;
            }
            break;
          case 0x15:
            uStack_1039._1_1_ = 0;
            local_10b0.len = 0;
            sVar4 = 0;
LAB_00127aeb:
            local_10b0.pos = sVar4;
            refreshLine(&local_10b0);
            break;
          case 0x17:
            linenoiseEditDeletePrevWord(&local_10b0);
            break;
          case 0x1b:
            sVar9 = read(local_10b0.ifd,&local_10b8,1);
            if (sVar9 != -1) {
              sVar9 = read(local_10b0.ifd,&local_10b7,1);
              if (sVar9 != -1) {
                if (local_10b8 == 'O') {
                  if (local_10b7 == 0x46) goto switchD_001278fa_caseD_5;
                  if (local_10b7 == 0x48) goto switchD_001278fa_caseD_1;
                }
                else if (local_10b8 == '[') {
                  if ((byte)(local_10b7 - 0x30) < 10) {
                    sVar9 = read(local_10b0.ifd,local_10b6,1);
                    if (((sVar9 != -1) && ((char)local_10b6[0] == '~')) && (local_10b7 == 0x33))
                    goto LAB_00127a15;
                  }
                  else {
                    switch(local_10b7) {
                    case 0x41:
                      goto switchD_001278fa_caseD_10;
                    case 0x42:
                      goto switchD_001278fa_caseD_e;
                    case 0x43:
                      goto switchD_001278fa_caseD_6;
                    case 0x44:
                      goto switchD_001278fa_caseD_2;
                    case 0x46:
                      goto switchD_001278fa_caseD_5;
                    case 0x48:
                      goto switchD_001278fa_caseD_1;
                    }
                  }
                }
              }
            }
            break;
          default:
            if ((uVar13 & 0xff) == 0x7f) goto switchD_001278fa_caseD_8;
switchD_001278fa_caseD_7:
            iVar5 = linenoiseEditInsert(&local_10b0,(char)uVar13);
            if (iVar5 != 0) goto LAB_00127ba2;
          }
switchD_00127aac_caseD_45:
          sVar9 = read(local_10b0.ifd,&local_10ba,1);
        } while (0 < (int)sVar9);
      }
      uVar12 = local_10b0.len & 0xffffffff;
    }
LAB_00127ba7:
    iVar5 = (int)uVar12;
    if ((rawmode == '\x01') && (iVar7 = tcsetattr(0,2,(termios *)&orig_termios), iVar7 != -1)) {
      rawmode = '\0';
    }
    putchar(10);
  }
  if (iVar5 == -1) {
    return (char *)0x0;
  }
LAB_00127bde:
  pcVar8 = strdup((char *)((long)&uStack_1039 + 1));
  return pcVar8;
}

Assistant:

char *linenoise(const char *prompt) {
	char buf[LINENOISE_MAX_LINE];
	int count;

	if (isUnsupportedTerm()) {
		size_t len;

		printf("%s",prompt);
		fflush(stdout);
		if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
		len = strlen(buf);
		while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
			len--;
			buf[len] = '\0';
		}
		return strdup(buf);
	} else {
		count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
		if (count == -1) return NULL;
		return strdup(buf);
	}
}